

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fibonacci.cpp
# Opt level: O0

int main(void)

{
  string_view func_name;
  ostream *poVar1;
  long lVar2;
  void *this;
  Profiler *this_00;
  void *__buf;
  int __fd;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string_view local_e0;
  ProfilerTimer local_c9;
  undefined4 local_c8;
  ProfilerTimer profile_40;
  int n;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  ScopedTimer JEB_ScopedTimer_36;
  
  JEB_ScopedTimer_36.stream_._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:36: "
             ,&local_b1);
  std::operator+(&local_90,&local_b0,"int main()");
  std::operator+(&local_70,&local_90,":\n\telapsed time = ");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  JEBDebug::
  ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ScopedTimerImpl((ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50,&local_70,poVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_c8 = 0x1b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp"
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"main");
  func_name._M_str = local_f0._M_str;
  func_name._M_len = local_f0._M_len;
  JEBDebug::ProfilerTimer::ProfilerTimer(&local_c9,local_e0,func_name,0x28);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:41: "
                          );
  poVar1 = std::operator<<(poVar1,"int main()");
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,"\n\tn = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1b);
  poVar1 = std::operator<<(poVar1,"\n\tfibonacci_rec(n) = ");
  lVar2 = fibonacci_rec(0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  poVar1 = std::operator<<(poVar1,"\n\tfibonacci_it(n) = ");
  lVar2 = fibonacci_it(0x1b);
  this = (void *)std::ostream::operator<<(poVar1,lVar2);
  __fd = 0x10e068;
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  JEBDebug::ProfilerTimer::~ProfilerTimer(&local_c9);
  this_00 = JEBDebug::Profiler::instance();
  JEBDebug::Profiler::write(this_00,__fd,__buf,local_f0._M_len);
  JEB_ScopedTimer_36.stream_._4_4_ = 0;
  JEBDebug::
  ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ScopedTimerImpl((ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_50);
  return JEB_ScopedTimer_36.stream_._4_4_;
}

Assistant:

int main()
{
    JEB_TIMEIT();

    {
        const int n = 27;
        JEB_PROFILE();
        JEB_SHOW(n, fibonacci_rec(n), fibonacci_it(n));
    }
    JEB_PROFILER_REPORT();
    return 0;
}